

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p12_utl.c
# Opt level: O0

uchar * OPENSSL_asc2uni(char *asc,int asclen,uchar **uni,int *unilen)

{
  int num;
  size_t sVar1;
  uchar *unitmp;
  int i;
  int ulen;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar2;
  int local_14;
  uchar *local_8;
  
  local_14 = asclen;
  if (asclen == -1) {
    sVar1 = strlen(asc);
    local_14 = (int)sVar1;
  }
  if (local_14 < 0) {
    local_8 = (uchar *)0x0;
  }
  else {
    num = local_14 * 2 + 2;
    local_8 = (uchar *)CRYPTO_malloc(num,"crypto/pkcs12/p12_utl.c",0x1b);
    if (local_8 == (uchar *)0x0) {
      ERR_new();
      ERR_set_debug((char *)uni,(int)((ulong)unilen >> 0x20),
                    (char *)CONCAT44(num,in_stack_ffffffffffffffd0));
      ERR_set_error(0x23,0xc0100,(char *)0x0);
      local_8 = (uchar *)0x0;
    }
    else {
      for (iVar2 = 0; iVar2 < num + -2; iVar2 = iVar2 + 2) {
        local_8[iVar2] = '\0';
        local_8[iVar2 + 1] = asc[iVar2 >> 1];
      }
      local_8[num + -2] = '\0';
      local_8[num + -1] = '\0';
      if (unilen != (int *)0x0) {
        *unilen = num;
      }
      if (uni != (uchar **)0x0) {
        *uni = local_8;
      }
    }
  }
  return local_8;
}

Assistant:

unsigned char *OPENSSL_asc2uni(const char *asc, int asclen,
                               unsigned char **uni, int *unilen)
{
    int ulen, i;
    unsigned char *unitmp;

    if (asclen == -1)
        asclen = strlen(asc);
    if (asclen < 0)
        return NULL;
    ulen = asclen * 2 + 2;
    if ((unitmp = OPENSSL_malloc(ulen)) == NULL) {
        ERR_raise(ERR_LIB_PKCS12, ERR_R_MALLOC_FAILURE);
        return NULL;
    }
    for (i = 0; i < ulen - 2; i += 2) {
        unitmp[i] = 0;
        unitmp[i + 1] = asc[i >> 1];
    }
    /* Make result double null terminated */
    unitmp[ulen - 2] = 0;
    unitmp[ulen - 1] = 0;
    if (unilen)
        *unilen = ulen;
    if (uni)
        *uni = unitmp;
    return unitmp;
}